

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int implode_callback(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  int iVar1;
  char *zString;
  int nLen;
  int local_1c;
  
  if (((*(int *)((long)pUserData + 8) == 0) || ((pValue->iFlags & 0x40) == 0)) ||
     (iVar1 = *(int *)((long)pUserData + 0x20), 0x1f < iVar1)) {
    zString = jx9_value_to_string(pValue,&local_1c);
    if (0 < local_1c) {
      if (0 < *(int *)((long)pUserData + 0x18)) {
        if (*(int *)((long)pUserData + 0x1c) == 0) {
          jx9_result_string(*pUserData,*(char **)((long)pUserData + 0x10),
                            *(int *)((long)pUserData + 0x18));
        }
        else {
          *(undefined4 *)((long)pUserData + 0x1c) = 0;
        }
      }
      jx9_result_string(*pUserData,zString,local_1c);
    }
  }
  else {
    if ((0 < *(int *)((long)pUserData + 0x18)) && (*(int *)((long)pUserData + 0x1c) == 0)) {
      jx9_result_string(*pUserData,*(char **)((long)pUserData + 0x10),
                        *(int *)((long)pUserData + 0x18));
      iVar1 = *(int *)((long)pUserData + 0x20);
    }
    *(undefined4 *)((long)pUserData + 0x1c) = 1;
    *(int *)((long)pUserData + 0x20) = iVar1 + 1;
    jx9HashmapWalk((jx9_hashmap *)(pValue->x).pOther,implode_callback,pUserData);
    *(int *)((long)pUserData + 0x20) = *(int *)((long)pUserData + 0x20) + -1;
  }
  return 0;
}

Assistant:

static int implode_callback(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	struct implode_data *pData = (struct implode_data *)pUserData;
	const char *zData;
	int nLen;
	if( pData->bRecursive && jx9_value_is_json_array(pValue) && pData->nRecCount < 32 ){
		if( pData->nSeplen > 0 ){
			if( !pData->bFirst ){
				/* append the separator first */
				jx9_result_string(pData->pCtx, pData->zSep, pData->nSeplen);
			}else{
				pData->bFirst = 0;
			}
		}
		/* Recurse */
		pData->bFirst = 1;
		pData->nRecCount++;
		jx9HashmapWalk((jx9_hashmap *)pValue->x.pOther, implode_callback, pData);
		pData->nRecCount--;
		return JX9_OK;
	}
	/* Extract the string representation of the entry value */
	zData = jx9_value_to_string(pValue, &nLen);
	if( nLen > 0 ){
		if( pData->nSeplen > 0 ){
			if( !pData->bFirst ){
				/* append the separator first */
				jx9_result_string(pData->pCtx, pData->zSep, pData->nSeplen);
			}else{
				pData->bFirst = 0;
			}
		}
		jx9_result_string(pData->pCtx, zData, nLen);
	}else{
		SXUNUSED(pKey); /* cc warning */
	}
	return JX9_OK;
}